

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
asn1::
mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,asn1 *this,
          uint8_t tag,vector<unsigned_char,_std::allocator<unsigned_char>_> *v,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *v_1)

{
  size_type sVar1;
  iterator __first;
  iterator __last;
  undefined7 in_register_00000011;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  const_iterator local_58;
  undefined1 local_4d;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vec2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_local_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_local;
  uint8_t tag_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vec;
  
  vec2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)v;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT71(in_register_00000011,tag),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             vec2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  local_4d = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  pushHead(__return_storage_ptr__,(uint8_t)this,(uint32_t)sVar1);
  local_60._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_58,&local_60);
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,local_58,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current);
  local_4d = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> mkSEQ(uint8_t tag, const V&... v)
{
    std::vector<uint8_t> vec2;
    mkSEQ(vec2, v...);

    std::vector<uint8_t> vec;
    pushHead(vec, tag, vec2.size());
    vec.insert(vec.end(), vec2.begin(), vec2.end());
    return vec;
}